

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_encode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_tcd *poVar1;
  bool bVar2;
  uint uVar3;
  OPJ_BOOL OVar4;
  OPJ_UINT32 p_src_length;
  opj_tcd_tilecomp_t *l_tilec_00;
  OPJ_BYTE *pOVar5;
  OPJ_BYTE *l_new_current_data;
  opj_image_comp_t *l_img_comp_1;
  opj_tcd_tilecomp_t *l_tilec;
  opj_image_comp_t *l_img_comp;
  opj_tcd_t *p_tcd;
  OPJ_BYTE *pOStack_48;
  OPJ_BOOL l_reuse_data;
  OPJ_BYTE *l_current_data;
  uint local_38;
  OPJ_UINT32 l_current_tile_size;
  OPJ_UINT32 l_max_tile_size;
  OPJ_UINT32 l_nb_tiles;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  local_38 = 0;
  pOStack_48 = (OPJ_BYTE *)0x0;
  bVar2 = false;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x278e,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_stream != (opj_stream_private_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x2790,
                    "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    poVar1 = p_j2k->m_tcd;
    uVar3 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
    if (uVar3 == 1) {
      bVar2 = true;
      for (l_max_tile_size = 0; l_max_tile_size < p_j2k->m_tcd->image->numcomps;
          l_max_tile_size = l_max_tile_size + 1) {
        if (((ulong)poVar1->image->comps[l_max_tile_size].data & 0xf) != 0) {
          bVar2 = false;
        }
      }
    }
    l_nb_tiles = 0;
    while( true ) {
      if (uVar3 <= l_nb_tiles) {
        if (pOStack_48 != (OPJ_BYTE *)0x0) {
          opj_free(pOStack_48);
        }
        return 1;
      }
      OVar4 = opj_j2k_pre_write_tile(p_j2k,l_nb_tiles,p_stream,p_manager);
      if (OVar4 == 0) break;
      for (l_max_tile_size = 0; l_max_tile_size < p_j2k->m_tcd->image->numcomps;
          l_max_tile_size = l_max_tile_size + 1) {
        l_tilec_00 = poVar1->tcd_image->tiles->comps + l_max_tile_size;
        if (bVar2) {
          l_tilec_00->data = poVar1->image->comps[l_max_tile_size].data;
          l_tilec_00->ownsData = 0;
        }
        else {
          OVar4 = opj_alloc_tile_component_data(l_tilec_00);
          if (OVar4 == 0) {
            opj_event_msg(p_manager,1,"Error allocating tile component data.");
            if (pOStack_48 != (OPJ_BYTE *)0x0) {
              opj_free(pOStack_48);
            }
            return 0;
          }
        }
      }
      p_src_length = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
      if (!bVar2) {
        pOVar5 = pOStack_48;
        if ((local_38 < p_src_length) &&
           (pOVar5 = (OPJ_BYTE *)opj_realloc(pOStack_48,(ulong)p_src_length),
           local_38 = p_src_length, pOVar5 == (OPJ_BYTE *)0x0)) {
          if (pOStack_48 != (OPJ_BYTE *)0x0) {
            opj_free(pOStack_48);
          }
          opj_event_msg(p_manager,1,"Not enough memory to encode all tiles\n");
          return 0;
        }
        pOStack_48 = pOVar5;
        opj_j2k_get_tile_data(p_j2k->m_tcd,pOStack_48);
        OVar4 = opj_tcd_copy_tile_data(p_j2k->m_tcd,pOStack_48,p_src_length);
        if (OVar4 == 0) {
          opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
          opj_free(pOStack_48);
          return 0;
        }
      }
      OVar4 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
      if (OVar4 == 0) {
        if (pOStack_48 != (OPJ_BYTE *)0x0) {
          opj_free(pOStack_48);
        }
        return 0;
      }
      l_nb_tiles = l_nb_tiles + 1;
    }
    if (pOStack_48 != (OPJ_BYTE *)0x0) {
      opj_free(pOStack_48);
    }
    return 0;
  }
  __assert_fail("p_stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x278f,
                "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)");
}

Assistant:

OPJ_BOOL opj_j2k_encode(opj_j2k_t * p_j2k,
                        opj_stream_private_t *p_stream,
                        opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 i, j;
        OPJ_UINT32 l_nb_tiles;
        OPJ_UINT32 l_max_tile_size = 0, l_current_tile_size;
        OPJ_BYTE * l_current_data = 00;
        OPJ_BOOL l_reuse_data = OPJ_FALSE;
        opj_tcd_t* p_tcd = 00;

        /* preconditions */
        assert(p_j2k != 00);
        assert(p_stream != 00);
        assert(p_manager != 00);
	
        p_tcd = p_j2k->m_tcd;

        l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
        if (l_nb_tiles == 1) {
                l_reuse_data = OPJ_TRUE;
#ifdef __SSE__
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
                        if (((size_t)l_img_comp->data & 0xFU) != 0U) { /* tile data shall be aligned on 16 bytes */
												        l_reuse_data = OPJ_FALSE;
                        }
                }
#endif
        }
        for (i=0;i<l_nb_tiles;++i) {
                if (! opj_j2k_pre_write_tile(p_j2k,i,p_stream,p_manager)) {
                        if (l_current_data) {
                                opj_free(l_current_data);
                        }
                        return OPJ_FALSE;
                }

                /* if we only have one tile, then simply set tile component data equal to image component data */
                /* otherwise, allocate the data */
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_tcd_tilecomp_t* l_tilec = p_tcd->tcd_image->tiles->comps + j;
                        if (l_reuse_data) {
												        opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
												        l_tilec->data  =  l_img_comp->data;
												        l_tilec->ownsData = OPJ_FALSE;
                        } else {
												        if(! opj_alloc_tile_component_data(l_tilec)) {
												                opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data." );
												                if (l_current_data) {
												                        opj_free(l_current_data);
												                }
												                return OPJ_FALSE;
												        }
                        }
                }
                l_current_tile_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
                if (!l_reuse_data) {
                        if (l_current_tile_size > l_max_tile_size) {
												        OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data, l_current_tile_size);
												        if (! l_new_current_data) {
												                if (l_current_data) {
												                        opj_free(l_current_data);
												                }
												                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to encode all tiles\n");
												                return OPJ_FALSE;
																}
																l_current_data = l_new_current_data;
																l_max_tile_size = l_current_tile_size;
                        }

                        /* copy image data (32 bit) to l_current_data as contiguous, all-component, zero offset buffer */
                        /* 32 bit components @ 8 bit precision get converted to 8 bit */
                        /* 32 bit components @ 16 bit precision get converted to 16 bit */
                        opj_j2k_get_tile_data(p_j2k->m_tcd,l_current_data);

                        /* now copy this data into the tile component */
                        if (! opj_tcd_copy_tile_data(p_j2k->m_tcd,l_current_data,l_current_tile_size)) {
																opj_event_msg(p_manager, EVT_ERROR, "Size mismatch between tile data and sent data." );
																opj_free(l_current_data);
																return OPJ_FALSE;
                        }
                }

                if (! opj_j2k_post_write_tile (p_j2k,p_stream,p_manager)) {
                        if (l_current_data) {
                                opj_free(l_current_data);
                        }
                        return OPJ_FALSE;
                }
        }

        if (l_current_data) {
                opj_free(l_current_data);
        }
        return OPJ_TRUE;
}